

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.c
# Opt level: O0

BUFFER_HANDLE BUFFER_clone(BUFFER_HANDLE handle)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  LOGGER_LOG l;
  BUFFER *b;
  BUFFER *suppliedBuff;
  BUFFER_HANDLE result;
  BUFFER_HANDLE handle_local;
  
  if (handle == (BUFFER_HANDLE)0x0) {
    suppliedBuff = (BUFFER *)0x0;
  }
  else {
    suppliedBuff = (BUFFER *)calloc(1,0x10);
    if (suppliedBuff == (BUFFER *)0x0) {
      suppliedBuff = (BUFFER *)0x0;
    }
    else {
      iVar1 = BUFFER_safemalloc(suppliedBuff,handle->size);
      if (iVar1 == 0) {
        memcpy(suppliedBuff->buffer,handle->buffer,handle->size);
        suppliedBuff->size = handle->size;
      }
      else {
        free(suppliedBuff);
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/deps/c-utility/src/buffer.c"
                    ,"BUFFER_clone",0x29e,1,"Failure: allocating temp buffer.");
        }
        suppliedBuff = (BUFFER *)0x0;
      }
    }
  }
  return suppliedBuff;
}

Assistant:

BUFFER_HANDLE BUFFER_clone(BUFFER_HANDLE handle)
{
    BUFFER_HANDLE result;
    if (handle == NULL)
    {
        result = NULL;
    }
    else
    {
        BUFFER* suppliedBuff = (BUFFER*)handle;
        BUFFER* b = (BUFFER*)calloc(1, sizeof(BUFFER));
        if (b != NULL)
        {
            if (BUFFER_safemalloc(b, suppliedBuff->size) != 0)
            {
                free(b);
                LogError("Failure: allocating temp buffer.");
                result = NULL;
            }
            else
            {
                (void)memcpy(b->buffer, suppliedBuff->buffer, suppliedBuff->size);
                b->size = suppliedBuff->size;
                result = (BUFFER_HANDLE)b;
            }
        }
        else
        {
            result = NULL;
        }
    }
    return result;
}